

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O0

void Omega_h::print_goal_stats
               (Mesh *mesh,char *name,Int ent_dim,Reals *values,MinMax<double> desired,
               MinMax<double> actual)

{
  I32 IVar1;
  fmtflags __fmtfl;
  _Setprecision _Var2;
  Omega_h_Family family;
  pointer psVar3;
  element_type *this;
  streamsize __prec;
  ostream *poVar4;
  char *pcVar5;
  double b;
  double b_00;
  fmtflags stream_state;
  streamsize precision_before;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  GO nmid;
  GO ntotal;
  pointer local_b8;
  GO nhigh;
  pointer local_a0;
  GO nlow;
  undefined1 local_88 [8];
  Bytes high_marks;
  Read<double> local_68;
  undefined1 local_58 [8];
  Bytes low_marks;
  Reals *values_local;
  Int ent_dim_local;
  char *name_local;
  Mesh *mesh_local;
  MinMax<double> actual_local;
  MinMax<double> desired_local;
  
  b_00 = desired.max;
  b = desired.min;
  low_marks.write_.shared_alloc_.direct_ptr = values;
  Read<double>::Read(&local_68,values);
  each_lt<double>((Omega_h *)local_58,&local_68,b);
  Read<double>::~Read(&local_68);
  Read<double>::Read((Read<double> *)&nlow,values);
  each_gt<double>((Omega_h *)local_88,(Read<double> *)&nlow,b_00);
  Read<double>::~Read((Read<double> *)&nlow);
  Read<signed_char>::Read((Read<signed_char> *)&nhigh,(Read<signed_char> *)local_58);
  psVar3 = (pointer)count_owned_marks(mesh,ent_dim,(Read<signed_char> *)&nhigh);
  Read<signed_char>::~Read((Read<signed_char> *)&nhigh);
  local_a0 = psVar3;
  Read<signed_char>::Read((Read<signed_char> *)&ntotal,(Read<signed_char> *)local_88);
  psVar3 = (pointer)count_owned_marks(mesh,ent_dim,(Read<signed_char> *)&ntotal);
  Read<signed_char>::~Read((Read<signed_char> *)&ntotal);
  local_b8 = psVar3;
  nmid = Mesh::nglobal_ents(mesh,ent_dim);
  local_d8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((nmid - (long)local_a0) - (long)local_b8);
  Mesh::comm((Mesh *)&precision_before);
  this = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &precision_before);
  IVar1 = Comm::rank(this);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)&precision_before);
  if (IVar1 == 0) {
    __prec = std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)))
    ;
    __fmtfl = std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)));
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    _Var2 = std::setprecision(2);
    std::operator<<(poVar4,_Var2);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,nmid);
    poVar4 = std::operator<<(poVar4," ");
    family = Mesh::family(mesh);
    pcVar5 = topological_plural_name(family,ent_dim);
    std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<((ostream *)&std::cout,", ");
    poVar4 = std::operator<<(poVar4,name);
    poVar4 = std::operator<<(poVar4," [");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,actual.min);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,actual.max);
    std::operator<<(poVar4,"]");
    if (local_a0 != (pointer)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)local_a0);
      poVar4 = std::operator<<(poVar4," <");
      std::ostream::operator<<(poVar4,b);
    }
    if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)local_d8._M_pi);
      poVar4 = std::operator<<(poVar4," in [");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,b);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,b_00);
      std::operator<<(poVar4,"]");
    }
    if (local_b8 != (pointer)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)local_b8);
      poVar4 = std::operator<<(poVar4," >");
      std::ostream::operator<<(poVar4,b_00);
    }
    std::operator<<((ostream *)&std::cout,'\n');
    std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),__fmtfl);
    std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),__prec);
  }
  Read<signed_char>::~Read((Read<signed_char> *)local_88);
  Read<signed_char>::~Read((Read<signed_char> *)local_58);
  return;
}

Assistant:

void print_goal_stats(Mesh* mesh, char const* name, Int ent_dim, Reals values,
    MinMax<Real> desired, MinMax<Real> actual) {
  auto low_marks = each_lt(values, desired.min);
  auto high_marks = each_gt(values, desired.max);
  auto nlow = count_owned_marks(mesh, ent_dim, low_marks);
  auto nhigh = count_owned_marks(mesh, ent_dim, high_marks);
  auto ntotal = mesh->nglobal_ents(ent_dim);
  auto nmid = ntotal - nlow - nhigh;
  if (mesh->comm()->rank() == 0) {
    auto precision_before = std::cout.precision();
    std::ios::fmtflags stream_state(std::cout.flags());
    std::cout << std::fixed << std::setprecision(2);
    std::cout << ntotal << " "
              << topological_plural_name(mesh->family(), ent_dim);
    std::cout << ", " << name << " [" << actual.min << "," << actual.max << "]";
    if (nlow) {
      std::cout << ", " << nlow << " <" << desired.min;
    }
    if (nmid) {
      std::cout << ", " << nmid << " in [" << desired.min << "," << desired.max
                << "]";
    }
    if (nhigh) {
      std::cout << ", " << nhigh << " >" << desired.max;
    }
    std::cout << '\n';
    std::cout.flags(stream_state);
    std::cout.precision(precision_before);
  }
}